

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.cpp
# Opt level: O2

int forward(socket_base_t *from_,zmq_socket_stats_t *from_stats_,socket_base_t *to_,
           zmq_socket_stats_t *to_stats_,socket_base_t *capture_,msg_t *msg_)

{
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  int *piVar4;
  long lVar5;
  socket_base_t *__optval;
  msg_t *__optlen;
  int more;
  int local_4c;
  zmq_socket_stats_t *local_48;
  zmq_socket_stats_t *local_40;
  size_t moresz;
  
  local_4c = 0;
  __optlen = msg_;
  __optval = capture_;
  local_48 = from_stats_;
  local_40 = to_stats_;
  do {
    if (local_4c == 1000) {
      return 0;
    }
    lVar5 = 0;
    do {
      sVar2 = zmq::socket_base_t::recv(from_,(int)msg_,(void *)0x1,(size_t)to_stats_,(int)__optval);
      if ((int)sVar2 < 0) {
        piVar4 = __errno_location();
        return -(uint)(local_4c == 0 || *piVar4 != 0xb);
      }
      sVar3 = zmq::msg_t::size(msg_);
      moresz = 4;
      to_stats_ = (zmq_socket_stats_t *)&moresz;
      iVar1 = zmq::socket_base_t::getsockopt
                        (from_,0xd,(int)&more,(int)to_stats_,__optval,(socklen_t *)__optlen);
      if (iVar1 < 0) {
        return -1;
      }
      iVar1 = capture(capture_,msg_,more);
      if (iVar1 < 0) {
        return -1;
      }
      sVar2 = zmq::socket_base_t::send
                        (to_,(int)msg_,(void *)(ulong)((uint)(more != 0) * 2),(size_t)to_stats_,
                         (int)__optval);
      if ((int)sVar2 < 0) {
        return -1;
      }
      lVar5 = lVar5 + sVar3;
    } while (more != 0);
    local_48->msg_in = local_48->msg_in + 1;
    local_48->bytes_in = local_48->bytes_in + lVar5;
    local_40->msg_out = local_40->msg_out + 1;
    local_40->bytes_out = local_40->bytes_out + lVar5;
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

static int forward (class zmq::socket_base_t *from_,
                    zmq_socket_stats_t *from_stats_,
                    class zmq::socket_base_t *to_,
                    zmq_socket_stats_t *to_stats_,
                    class zmq::socket_base_t *capture_,
                    zmq::msg_t *msg_)
{
    // Forward a burst of messages
    for (unsigned int i = 0; i < zmq::proxy_burst_size; i++) {
        int more;
        size_t moresz;
        size_t complete_msg_size = 0;

        // Forward all the parts of one message
        while (true) {
            int rc = from_->recv (msg_, ZMQ_DONTWAIT);
            if (rc < 0) {
                if (likely (errno == EAGAIN && i > 0))
                    return 0; // End of burst

                return -1;
            }

            complete_msg_size += msg_->size ();

            moresz = sizeof more;
            rc = from_->getsockopt (ZMQ_RCVMORE, &more, &moresz);
            if (unlikely (rc < 0))
                return -1;

            //  Copy message to capture socket if any
            rc = capture (capture_, msg_, more);
            if (unlikely (rc < 0))
                return -1;

            rc = to_->send (msg_, more ? ZMQ_SNDMORE : 0);
            if (unlikely (rc < 0))
                return -1;

            if (more == 0)
                break;
        }

        // A multipart message counts as 1 packet:
        from_stats_->msg_in++;
        from_stats_->bytes_in += complete_msg_size;
        to_stats_->msg_out++;
        to_stats_->bytes_out += complete_msg_size;
    }

    return 0;
}